

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.cpp
# Opt level: O0

string * __thiscall Record::toString_abi_cxx11_(string *__return_storage_ptr__,Record *this)

{
  string local_e8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Record *local_18;
  Record *this_local;
  
  local_18 = this;
  this_local = (Record *)__return_storage_ptr__;
  std::operator+(&local_98,&this->tconst,",");
  std::__cxx11::to_string(&local_b8,this->averageRating);
  std::operator+(&local_78,&local_98,&local_b8);
  std::operator+(&local_58,&local_78,",");
  std::__cxx11::to_string(&local_e8,this->numVotes);
  std::operator+(&local_38,&local_58,&local_e8);
  std::operator+(__return_storage_ptr__,&local_38,"\n");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string Record::toString() {
    return tconst + "," + std::to_string(averageRating) + "," + std::to_string(numVotes) + "\n";
}